

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool google::protobuf::TextFormat::Print(Message *message,ZeroCopyOutputStream *output)

{
  bool bVar1;
  Printer local_a8;
  
  Printer::Printer(&local_a8);
  bVar1 = Printer::Print(&local_a8,message,output);
  Printer::~Printer(&local_a8);
  return bVar1;
}

Assistant:

bool TextFormat::Print(const Message& message,
                                    io::ZeroCopyOutputStream* output) {
  return Printer().Print(message, output);
}